

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O3

fvar<double,_2UL> * __thiscall
ising::free_energy::square::
finite<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,square *this,uint Lx,uint Ly,double Jx,
          double Jy,fvar<double,_2UL> beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  byte bVar14;
  uint uVar15;
  size_t i_1;
  double *pdVar16;
  invalid_argument *this_00;
  undefined4 in_register_0000000c;
  size_t i;
  long lVar17;
  undefined1 *puVar18;
  undefined4 in_register_00000014;
  fvar<double,_2UL> *pfVar19;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *extraout_RDX;
  fvar<double,_2UL> *cr_00;
  long lVar20;
  fvar<double,_2UL> *cr_01;
  fvar<double,_2UL> *cr_02;
  double *pdVar21;
  fvar<double,_2UL> *cr_03;
  fvar<double,_2UL> *cr_04;
  fvar<double,_2UL> *cr_05;
  fvar<double,_2UL> *extraout_RDX_00;
  fvar<double,_2UL> *cr_06;
  fvar<double,_2UL> *cr_07;
  fvar<double,_2UL> *extraout_RDX_01;
  fvar<double,_2UL> *cr_08;
  fvar<double,_2UL> *cr_09;
  fvar<double,_2UL> *cr_10;
  fvar<double,_2UL> *cr_11;
  ulong uVar22;
  double *pdVar23;
  detail *pdVar24;
  long lVar25;
  double *pdVar26;
  size_t i_35;
  detail *pdVar27;
  bool bVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar31;
  double dVar32;
  fvar<double,_2UL> retval_4;
  fvar<double,_2UL> retval_18;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_14;
  fvar<double,_2UL> retval_1;
  fvar<double,_2UL> retval;
  fvar<double,_2UL> retval_2;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> cosh_g;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> logZ;
  fvar<double,_2UL> retval_9;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> gamma0;
  fvar<double,_2UL> retval_12;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_57;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_52;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_45;
  fvar<double,_2UL> local_378;
  fvar<double,_2UL> *local_358;
  undefined1 auStack_350 [24];
  undefined1 local_338 [16];
  double *local_328;
  undefined1 local_318 [8];
  double dStack_310;
  double *local_308;
  detail local_300 [8];
  fvar<double,_2UL> local_2f8;
  undefined1 local_2d8 [16];
  double *pdStack_2c8;
  fvar<double,_2UL> local_2b8;
  fvar<double,_2UL> *local_2a0;
  fvar<double,_2UL> local_298;
  root_type *local_280;
  uint local_274;
  uint local_270;
  uint local_26c;
  double local_268;
  double local_258 [4];
  double local_238;
  double *pdStack_230;
  double *local_220;
  uint local_214;
  double local_210 [3];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  ulong local_1d8;
  fvar<double,_2UL> *local_1d0;
  double local_1c8;
  double *pdStack_1c0;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  double local_198 [4];
  double local_178 [4];
  fvar<double,_2UL> local_158;
  root_type *local_140;
  double dStack_138;
  double *local_130;
  undefined1 local_128 [16];
  fvar<double,_2UL> *local_118;
  double local_108 [4];
  double local_e8;
  double local_e0;
  fvar<double,_2UL> *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  fvar<double,_2UL> local_c0;
  double local_a8;
  double *pdStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double adStack_78 [9];
  
  pfVar19 = (fvar<double,_2UL> *)CONCAT44(in_register_00000014,Lx);
  i = CONCAT44(in_register_0000000c,Ly);
  local_274 = (uint)this;
  if ((local_274 == 0) || (uVar22 = (ulong)Lx, Lx == 0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,this,pfVar19,i);
    std::invalid_argument::invalid_argument(this_00,"Lx and Ly should be positive");
  }
  else {
    if ((0.0 < Jx) && (0.0 < Jy)) {
      local_2a0 = (fvar<double,_2UL> *)beta.v._M_elems[0];
      auVar6._8_8_ = -(ulong)(beta.v._M_elems[2] != 0.0);
      auVar6._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
      uVar15 = movmskpd((int)&beta,auVar6);
      if ((uVar15 & 1) == 0) {
        local_238 = beta.v._M_elems[1];
        dVar32 = beta.v._M_elems[1];
      }
      else {
        dVar32 = beta.v._M_elems[1] * Jx;
        local_238 = beta.v._M_elems[1] * Jy;
      }
      pdStack_230 = (double *)beta.v._M_elems[2];
      bVar28 = (uVar15 & 2) != 0;
      dVar31 = beta.v._M_elems[2];
      if (bVar28) {
        dVar31 = beta.v._M_elems[2] * Jx;
      }
      uVar30 = (undefined4)((ulong)dVar31 >> 0x20);
      uVar29 = SUB84(dVar31,0);
      dVar5 = Jx * beta.v._M_elems[0];
      if (bVar28) {
        pdStack_230 = (double *)(beta.v._M_elems[2] * Jy);
      }
      local_258[2] = 0.0;
      local_258[0] = 0.0;
      local_258[1] = 0.0;
      local_178[2] = 0.0;
      local_178[0] = 0.0;
      local_178[1] = 0.0;
      local_198[2] = 0.0;
      local_198[0] = 0.0;
      local_198[1] = 0.0;
      local_108[2] = 0.0;
      local_108[0] = 0.0;
      local_108[1] = 0.0;
      unique0x10001d75 = uVar29;
      local_2d8._8_8_ = dVar32;
      unique0x10001d79 = uVar30;
      local_2d8._0_8_ = dVar5 + dVar5;
      if ((dVar32 != 0.0) || (NAN(dVar32))) {
        local_2d8._8_8_ = dVar32 + dVar32;
      }
      local_128._8_4_ = in_XMM0_Dc;
      local_128._0_8_ = dVar5;
      local_128._12_4_ = in_XMM0_Dd;
      local_1e8._8_4_ = uVar29;
      local_1e8._0_8_ = dVar32;
      local_1e8._12_4_ = uVar30;
      local_1b8._8_4_ = uVar29;
      local_1b8._0_8_ = dVar31;
      local_1b8._12_4_ = uVar30;
      if (dVar31 != 0.0) {
        pdStack_2c8 = (double *)(dVar31 + dVar31);
      }
      local_268 = Jy;
      local_220 = (double *)__return_storage_ptr__;
      local_118 = (fvar<double,_2UL> *)local_2d8._0_8_;
      boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                ((fvar<double,_2UL> *)local_338,(detail *)local_2d8,pfVar19);
      local_2f8.v._M_elems[1] = (double)local_338._8_8_;
      local_2f8.v._M_elems[2] = (double)local_328;
      local_2f8.v._M_elems[0] = (double)local_338._0_8_ + 1.0;
      local_2b8.v._M_elems[1] = (double)local_1e8._0_8_;
      local_2b8.v._M_elems[2] = (double)local_1e8._8_8_;
      local_2b8.v._M_elems[0] = (double)local_118;
      if (((double)local_1e8._0_8_ != 0.0) || (NAN((double)local_1e8._0_8_))) {
        local_2b8.v._M_elems[1] = (double)local_1e8._0_8_ + (double)local_1e8._0_8_;
      }
      if ((double)local_1e8._8_8_ != 0.0) {
        local_2b8.v._M_elems[2] = (double)local_1b8._0_8_ + (double)local_1b8._0_8_;
      }
      local_2a0 = (fvar<double,_2UL> *)((double)local_2a0 * local_268);
      local_280 = (root_type *)local_2f8.v._M_elems[0];
      boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                ((fvar<double,_2UL> *)local_318,(detail *)&local_2b8,cr);
      pdVar16 = (double *)&local_378;
      local_378.v._M_elems[0] = (double)((double)local_280 / (double)local_318);
      lVar17 = 1;
      pdVar27 = (detail *)(local_318 + 0x10);
      do {
        dVar32 = 0.0;
        pdVar21 = pdVar16;
        pdVar24 = (detail *)(local_318 + 8);
        do {
          dVar32 = dVar32 + *(double *)pdVar24 * *pdVar21;
          pdVar24 = pdVar24 + 8;
          pdVar21 = pdVar21 + -1;
        } while (pdVar24 != pdVar27);
        local_378.v._M_elems[lVar17] = (local_2f8.v._M_elems[lVar17] - dVar32) / (double)local_318;
        lVar17 = lVar17 + 1;
        pdVar16 = pdVar16 + 1;
        pdVar27 = local_300;
      } while (lVar17 != 3);
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&local_298,(detail *)&local_378,(fvar<double,_2UL> *)(local_318 + 8));
      local_2a0 = (fvar<double,_2UL> *)((double)local_2a0 + (double)local_2a0);
      local_358 = local_2a0;
      if ((local_238 != 0.0) || (auStack_350._0_8_ = local_238, NAN(local_238))) {
        auStack_350._0_8_ = local_238 + local_238;
      }
      local_1f8._8_8_ = pdStack_230;
      local_1f8._0_8_ = pdStack_230;
      local_298.v._M_elems[1] = local_1e8._0_8_;
      local_298.v._M_elems[2] = local_1e8._8_8_;
      auStack_350._8_8_ = pdStack_230;
      if ((double)pdStack_230 != 0.0) {
        auStack_350._8_8_ = (double)pdStack_230 + (double)pdStack_230;
      }
      lVar17 = 0;
      do {
        (&local_140)[lVar17] =
             (root_type *)
             (local_298.v._M_elems[lVar17] - *(double *)(auStack_350 + lVar17 * 8 + -8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      local_214 = Lx * 2;
      uVar29 = local_128._0_4_;
      uVar30 = local_128._4_4_;
      local_1d8 = uVar22;
      if (local_214 != 0) {
        local_e8 = (double)uVar22;
        local_1a8 = (double)local_274;
        auVar1._8_4_ = (int)-(ulong)(local_298.v._M_elems[2] != 0.0);
        auVar1._0_8_ = -(ulong)(local_298.v._M_elems[1] != 0.0);
        auVar1._12_4_ = (int)(-(ulong)(local_298.v._M_elems[2] != 0.0) >> 0x20);
        local_26c = movmskpd(local_274,auVar1);
        bVar13 = (byte)local_26c >> 1;
        local_88._8_4_ = local_1e8._8_4_;
        local_88._0_8_ = local_298.v._M_elems[1] + local_298.v._M_elems[1];
        local_88._12_4_ = local_1e8._12_4_;
        local_98._8_4_ = local_1b8._8_4_;
        local_98._0_8_ = local_1b8._0_8_ + local_1b8._0_8_;
        local_98._12_4_ = local_1b8._12_4_;
        auVar2._8_4_ = (int)-(ulong)((double)pdStack_230 != 0.0);
        auVar2._0_8_ = -(ulong)(local_238 != 0.0);
        auVar2._12_4_ = (int)(-(ulong)((double)pdStack_230 != 0.0) >> 0x20);
        local_270 = movmskpd(CONCAT31((int3)(local_26c >> 8),bVar13),auVar2);
        bVar14 = (byte)local_270 >> 1;
        local_a8 = local_238 + local_238;
        pdStack_a0 = pdStack_230;
        local_1f8._8_4_ = (int)pdStack_230;
        local_1f8._0_8_ = (double)pdStack_230 + (double)pdStack_230;
        local_1f8._12_4_ = (int)((ulong)pdStack_230 >> 0x20);
        local_268 = 0.0;
        local_280 = (root_type *)0x0;
        uStack_1a0 = 0;
        pfVar19 = extraout_RDX;
        do {
          local_2d8._0_8_ = local_118;
          if ((local_26c & 1) != 0) {
            local_298.v._M_elems[1] = (double)local_88._0_8_;
          }
          if (bVar13 != 0) {
            local_298.v._M_elems[2] = (double)local_98._0_8_;
          }
          pdStack_2c8 = (double *)local_298.v._M_elems[2];
          local_2d8._8_8_ = local_298.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                    ((fvar<double,_2UL> *)local_338,(detail *)local_2d8,pfVar19);
          local_2b8.v._M_elems[1] = local_238;
          local_2b8.v._M_elems[2] = (double)pdStack_230;
          local_2b8.v._M_elems[0] = (double)local_2a0;
          if ((local_270 & 1) != 0) {
            local_2b8.v._M_elems[1] = local_a8;
          }
          if (bVar14 != 0) {
            local_2b8.v._M_elems[2] = (double)local_1f8._0_8_;
          }
          boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                    ((fvar<double,_2UL> *)local_318,(detail *)&local_2b8,cr_00);
          lVar17 = 2;
          puVar18 = local_338;
          lVar20 = 0;
          do {
            if ((detail *)((long)&local_2f8 + lVar17 * -8 + -8) == (detail *)local_318) {
              dVar32 = 0.0;
            }
            else {
              dVar32 = 0.0;
              lVar25 = 0;
              pdVar27 = (detail *)local_318;
              do {
                dVar32 = dVar32 + *(double *)pdVar27 * *(double *)(puVar18 + lVar25);
                pdVar27 = pdVar27 + 8;
                lVar25 = lVar25 + -8;
              } while (lVar17 * 8 + -0x18 != lVar25);
            }
            local_2f8.v._M_elems[lVar20] = dVar32;
            lVar20 = lVar20 + 1;
            bVar28 = lVar17 == 0;
            lVar17 = lVar17 + -1;
            if (bVar28) {
              lVar17 = 0;
            }
            puVar18 = puVar18 + 8;
          } while (lVar20 != 3);
          local_e0 = cos(((double)local_280 * 3.141592653589793) / local_e8);
          local_1c8 = local_238;
          pdStack_1c0 = pdStack_230;
          local_1d0 = local_2a0;
          if ((local_270 & 1) != 0) {
            local_1c8 = local_a8;
          }
          if (bVar14 != 0) {
            pdStack_1c0 = (double *)local_1f8._0_8_;
          }
          boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                    (&local_158,(detail *)&local_1d0,cr_01);
          local_358 = (fvar<double,_2UL> *)(local_158.v._M_elems[0] * local_e0);
          if ((local_158.v._M_elems[1] != 0.0) ||
             (auStack_350._0_8_ = local_158.v._M_elems[1], NAN(local_158.v._M_elems[1]))) {
            auStack_350._0_8_ = local_e0 * local_158.v._M_elems[1];
          }
          auStack_350._8_8_ = local_158.v._M_elems[2];
          if (local_158.v._M_elems[2] != 0.0) {
            auStack_350._8_8_ = local_e0 * local_158.v._M_elems[2];
          }
          lVar17 = 0;
          do {
            local_378.v._M_elems[lVar17] =
                 local_2f8.v._M_elems[lVar17] - *(double *)(auStack_350 + lVar17 * 8 + -8);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_d0 = local_1e8._0_8_;
          uStack_c8 = local_1e8._8_8_;
          local_d8 = local_118;
          if ((local_26c & 1) != 0) {
            local_d0 = local_88._0_8_;
          }
          if (bVar13 != 0) {
            uStack_c8 = local_98._0_8_;
          }
          boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                    (&local_c0,(detail *)&local_d8,cr_02);
          local_298.v._M_elems[0] = local_378.v._M_elems[0] / local_c0.v._M_elems[0];
          lVar17 = 1;
          pdVar16 = (double *)&local_298;
          pdVar21 = local_c0.v._M_elems + 2;
          do {
            dVar32 = 0.0;
            pdVar23 = pdVar16;
            pdVar26 = local_c0.v._M_elems + 1;
            do {
              dVar32 = dVar32 + *pdVar26 * *pdVar23;
              pdVar26 = pdVar26 + 1;
              pdVar23 = pdVar23 + -1;
            } while (pdVar26 != pdVar21);
            local_298.v._M_elems[lVar17] =
                 (local_378.v._M_elems[lVar17] - dVar32) / local_c0.v._M_elems[0];
            lVar17 = lVar17 + 1;
            pdVar16 = pdVar16 + 1;
            pdVar21 = &local_a8;
          } while (lVar17 != 3);
          if (local_268._0_4_ == 0) {
            if ((double)local_140 < 0.0) {
              local_378.v._M_elems[2] = (double)local_130;
              local_378.v._M_elems[0] = (double)local_140;
              local_378.v._M_elems[1] = dStack_138;
              pdVar16 = (double *)0x0;
              do {
                *(ulong *)((long)local_378.v._M_elems + (long)pdVar16) =
                     *(ulong *)((long)local_378.v._M_elems + (long)pdVar16) ^ 0x8000000000000000;
                pdVar16 = pdVar16 + 1;
              } while (pdVar16 != (double *)0x18);
              goto LAB_0010fda7;
            }
            uVar29 = (undefined4)local_1a8;
            uVar30 = local_1a8._4_4_;
            if (((double)local_140 != 0.0) || (NAN((double)local_140))) {
              local_378.v._M_elems[2] = (double)local_130;
              local_378.v._M_elems[0] = (double)local_140;
              local_378.v._M_elems[1] = dStack_138;
              pdVar16 = local_130;
            }
            else {
              local_378.v._M_elems[0] = 0.0;
              local_378.v._M_elems[1] = 0.0;
              local_378.v._M_elems[2] = 0.0;
              pdVar16 = (double *)0x3;
            }
LAB_00110174:
            auVar9._8_8_ = -(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar9._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            uVar15 = movmskpd((int)pdVar16,auVar9);
            local_338._8_8_ = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              local_338._8_8_ = local_378.v._M_elems[1] * (double)CONCAT44(uVar30,uVar29);
            }
            local_328 = (double *)local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              local_328 = (double *)(local_378.v._M_elems[2] * (double)CONCAT44(uVar30,uVar29));
            }
            local_338._0_8_ = local_378.v._M_elems[0] * (double)CONCAT44(uVar30,uVar29);
            lVar17 = 0;
            do {
              *(double *)(local_338 + lVar17) = *(double *)(local_338 + lVar17) * 0.5;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            auVar10._8_8_ = -(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar10._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            uVar15 = movmskpd(0x18,auVar10);
            auStack_350._0_8_ = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              auStack_350._0_8_ = local_378.v._M_elems[1] * (double)CONCAT44(uVar30,uVar29);
            }
            auStack_350._8_8_ = local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              auStack_350._8_8_ = local_378.v._M_elems[2] * (double)CONCAT44(uVar30,uVar29);
            }
            local_358 = (fvar<double,_2UL> *)
                        (local_378.v._M_elems[0] * (double)CONCAT44(uVar30,uVar29));
            lVar17 = 0;
            do {
              *(ulong *)(auStack_350 + lVar17 + -8) =
                   *(ulong *)(auStack_350 + lVar17 + -8) ^ 0x8000000000000000;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            local_2f8.v._M_elems[0] = exp((double)local_358);
            local_2d8._0_8_ = &local_2f8;
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
            apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                      (&local_2b8,&local_358,2,(anon_class_8_1_3fcf650a *)local_2d8);
            dStack_310 = local_2b8.v._M_elems[1];
            local_308 = (double *)local_2b8.v._M_elems[2];
            local_318 = (undefined1  [8])(local_2b8.v._M_elems[0] + 1.0);
            boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                      ((fvar<double,_2UL> *)local_2d8,(detail *)local_318,cr_06);
            lVar17 = 0;
            do {
              local_2f8.v._M_elems[lVar17] =
                   *(double *)(local_338 + lVar17 * 8) + *(double *)(local_2d8 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar17 = 0;
            do {
              local_198[lVar17] = local_2f8.v._M_elems[lVar17] + local_198[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            auVar11._8_8_ = -(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar11._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            uVar15 = movmskpd(3,auVar11);
            local_338._8_8_ = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              local_338._8_8_ = local_378.v._M_elems[1] * local_1a8;
            }
            local_328 = (double *)local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              local_328 = (double *)(local_378.v._M_elems[2] * local_1a8);
            }
            local_338._0_8_ = local_378.v._M_elems[0] * local_1a8;
            lVar17 = 0;
            do {
              *(double *)(local_338 + lVar17) = *(double *)(local_338 + lVar17) * 0.5;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            auVar12._8_8_ = -(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar12._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            uVar15 = movmskpd(0x18,auVar12);
            auStack_350._0_8_ = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              auStack_350._0_8_ = local_378.v._M_elems[1] * local_1a8;
            }
            auStack_350._8_8_ = local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              auStack_350._8_8_ = local_378.v._M_elems[2] * local_1a8;
            }
            local_358 = (fvar<double,_2UL> *)(local_378.v._M_elems[0] * local_1a8);
            lVar17 = 0;
            do {
              *(ulong *)(auStack_350 + lVar17 + -8) =
                   *(ulong *)(auStack_350 + lVar17 + -8) ^ 0x8000000000000000;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            local_2f8.v._M_elems[0] = exp((double)local_358);
            local_2d8._0_8_ = &local_2f8;
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
            apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                      (&local_2b8,&local_358,2,(anon_class_8_1_3fcf650a *)local_2d8);
            local_318 = (undefined1  [8])local_2b8.v._M_elems[0];
            dStack_310 = local_2b8.v._M_elems[1];
            local_308 = (double *)local_2b8.v._M_elems[2];
            lVar17 = 0;
            do {
              *(ulong *)(local_318 + lVar17) = *(ulong *)(local_318 + lVar17) ^ 0x8000000000000000;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            local_318 = (undefined1  [8])((double)local_318 + 1.0);
            boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                      ((fvar<double,_2UL> *)local_2d8,(detail *)local_318,cr_07);
            lVar17 = 0;
            do {
              local_2f8.v._M_elems[lVar17] =
                   *(double *)(local_338 + lVar17 * 8) + *(double *)(local_2d8 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar17 = 0;
            do {
              local_108[lVar17] = local_2f8.v._M_elems[lVar17] + local_108[lVar17];
              lVar17 = lVar17 + 1;
              pfVar19 = extraout_RDX_01;
            } while (lVar17 != 3);
          }
          else {
            lVar17 = 2;
            lVar20 = 0;
            pdVar16 = (double *)&local_298;
            do {
              if ((fvar<double,_2UL> *)(&local_280 + -lVar17) == &local_298) {
                dVar32 = 0.0;
              }
              else {
                dVar32 = 0.0;
                lVar25 = 0;
                pdVar21 = (double *)&local_298;
                do {
                  dVar32 = dVar32 + *pdVar21 * *(double *)((long)pdVar16 + lVar25);
                  pdVar21 = pdVar21 + 1;
                  lVar25 = lVar25 + -8;
                } while (lVar17 * 8 + -0x18 != lVar25);
              }
              *(double *)(local_318 + lVar20 * 8) = dVar32;
              lVar20 = lVar20 + 1;
              bVar28 = lVar17 == 0;
              lVar17 = lVar17 + -1;
              if (bVar28) {
                lVar17 = 0;
              }
              pdVar16 = pdVar16 + 1;
            } while (lVar20 != 3);
            pdStack_2c8 = local_308;
            local_2d8._8_8_ = dStack_310;
            local_2d8._0_8_ = (double)local_318 + -1.0;
            boost::math::differentiation::autodiff_v1::detail::sqrt<double,2ul>
                      ((fvar<double,_2UL> *)local_338,(detail *)local_2d8,(fvar<double,_2UL> *)0x3);
            lVar17 = 0;
            do {
              local_2f8.v._M_elems[lVar17] =
                   local_298.v._M_elems[lVar17] + *(double *)(local_338 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            pdVar16 = (double *)
                      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                                (&local_378,(detail *)&local_2f8,cr_03);
LAB_0010fda7:
            uVar29 = (undefined4)local_1a8;
            uVar30 = local_1a8._4_4_;
            if (((ulong)local_268 & 1) == 0) goto LAB_00110174;
            auVar3._8_4_ = (int)-(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar3._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            auVar3._12_4_ = (int)(-(ulong)(local_378.v._M_elems[2] != 0.0) >> 0x20);
            uVar15 = movmskpd((int)pdVar16,auVar3);
            dVar32 = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              dVar32 = local_378.v._M_elems[1] *
                       (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8);
            }
            pdVar16 = (double *)local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              pdVar16 = (double *)
                        (local_378.v._M_elems[2] *
                        (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8));
            }
            local_338._0_8_ =
                 local_378.v._M_elems[0] * (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8);
            unique0x10000bf1 = (int)pdVar16;
            local_338._8_8_ = dVar32;
            unique0x10000bf5 = (int)((ulong)pdVar16 >> 0x20);
            lVar17 = 0;
            do {
              *(double *)(local_338 + lVar17) = *(double *)(local_338 + lVar17) * 0.5;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            auVar4._8_4_ = (int)-(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar4._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            auVar4._12_4_ = (int)(-(ulong)(local_378.v._M_elems[2] != 0.0) >> 0x20);
            uVar15 = movmskpd(0x18,auVar4);
            dVar32 = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              dVar32 = local_378.v._M_elems[1] *
                       (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8);
            }
            pdVar16 = (double *)local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              pdVar16 = (double *)
                        (local_378.v._M_elems[2] *
                        (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8));
            }
            local_358 = (fvar<double,_2UL> *)
                        (local_378.v._M_elems[0] *
                        (double)CONCAT44(local_1a8._4_4_,(undefined4)local_1a8));
            auStack_350._8_4_ = (int)pdVar16;
            auStack_350._0_8_ = dVar32;
            auStack_350._12_4_ = (int)((ulong)pdVar16 >> 0x20);
            lVar17 = 0;
            do {
              *(ulong *)(auStack_350 + lVar17 + -8) =
                   *(ulong *)(auStack_350 + lVar17 + -8) ^ 0x8000000000000000;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            local_2f8.v._M_elems[0] = exp((double)local_358);
            local_2d8._0_8_ = &local_2f8;
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
            apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                      (&local_2b8,&local_358,2,(anon_class_8_1_3fcf650a *)local_2d8);
            dStack_310 = local_2b8.v._M_elems[1];
            local_308 = (double *)local_2b8.v._M_elems[2];
            local_318 = (undefined1  [8])(local_2b8.v._M_elems[0] + 1.0);
            boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                      ((fvar<double,_2UL> *)local_2d8,(detail *)local_318,cr_04);
            lVar17 = 0;
            do {
              local_2f8.v._M_elems[lVar17] =
                   *(double *)(local_338 + lVar17 * 8) + *(double *)(local_2d8 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar17 = 0;
            do {
              local_258[lVar17] = local_2f8.v._M_elems[lVar17] + local_258[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            auVar7._8_8_ = -(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar7._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            uVar15 = movmskpd(3,auVar7);
            local_338._8_8_ = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              local_338._8_8_ = local_378.v._M_elems[1] * local_1a8;
            }
            local_328 = (double *)local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              local_328 = (double *)(local_378.v._M_elems[2] * local_1a8);
            }
            local_338._0_8_ = local_378.v._M_elems[0] * local_1a8;
            lVar17 = 0;
            do {
              *(double *)(local_338 + lVar17) = *(double *)(local_338 + lVar17) * 0.5;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            auVar8._8_8_ = -(ulong)(local_378.v._M_elems[2] != 0.0);
            auVar8._0_8_ = -(ulong)(local_378.v._M_elems[1] != 0.0);
            uVar15 = movmskpd(0x18,auVar8);
            auStack_350._0_8_ = local_378.v._M_elems[1];
            if ((uVar15 & 1) != 0) {
              auStack_350._0_8_ = local_378.v._M_elems[1] * local_1a8;
            }
            auStack_350._8_8_ = local_378.v._M_elems[2];
            if ((uVar15 & 2) != 0) {
              auStack_350._8_8_ = local_378.v._M_elems[2] * local_1a8;
            }
            local_358 = (fvar<double,_2UL> *)(local_378.v._M_elems[0] * local_1a8);
            lVar17 = 0;
            do {
              *(ulong *)(auStack_350 + lVar17 + -8) =
                   *(ulong *)(auStack_350 + lVar17 + -8) ^ 0x8000000000000000;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            local_2f8.v._M_elems[0] = exp((double)local_358);
            local_2d8._0_8_ = &local_2f8;
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
            apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                      (&local_2b8,&local_358,2,(anon_class_8_1_3fcf650a *)local_2d8);
            local_318 = (undefined1  [8])local_2b8.v._M_elems[0];
            dStack_310 = local_2b8.v._M_elems[1];
            local_308 = (double *)local_2b8.v._M_elems[2];
            lVar17 = 0;
            do {
              *(ulong *)(local_318 + lVar17) = *(ulong *)(local_318 + lVar17) ^ 0x8000000000000000;
              lVar17 = lVar17 + 8;
            } while (lVar17 != 0x18);
            local_318 = (undefined1  [8])((double)local_318 + 1.0);
            boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                      ((fvar<double,_2UL> *)local_2d8,(detail *)local_318,cr_05);
            lVar17 = 0;
            do {
              local_2f8.v._M_elems[lVar17] =
                   *(double *)(local_338 + lVar17 * 8) + *(double *)(local_2d8 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar17 = 0;
            do {
              local_178[lVar17] = local_2f8.v._M_elems[lVar17] + local_178[lVar17];
              lVar17 = lVar17 + 1;
              pfVar19 = extraout_RDX_00;
            } while (lVar17 != 3);
          }
          local_280 = (root_type *)((double)local_280 + 1.0);
          uVar15 = SUB84(local_268,0) + 1;
          local_268 = (double)(ulong)uVar15;
          uVar29 = local_128._0_4_;
          uVar30 = local_128._4_4_;
          local_298.v._M_elems[1] = (double)local_1e8._0_8_;
          local_298.v._M_elems[2] = (double)local_1e8._8_8_;
        } while (uVar15 != local_214);
      }
      local_268 = (double)((int)local_1d8 * local_274);
      local_298.v._M_elems[0] = -0.6931471805599453 / local_268 + (double)CONCAT44(uVar30,uVar29);
      local_318 = (undefined1  [8])((double)CONCAT44(uVar30,uVar29) * -4.0);
      if ((local_298.v._M_elems[1] != 0.0) ||
         (dStack_310 = local_298.v._M_elems[1], NAN(local_298.v._M_elems[1]))) {
        dStack_310 = local_298.v._M_elems[1] * -4.0;
      }
      local_308 = (double *)local_298.v._M_elems[2];
      if (local_298.v._M_elems[2] != 0.0) {
        local_308 = (double *)((double)local_1b8._0_8_ * -4.0);
      }
      local_378.v._M_elems[0] = exp((double)local_318);
      local_2f8.v._M_elems[0] = (double)&local_378;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
      apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                ((fvar<double,_2UL> *)local_2d8,local_318,2,(anon_class_8_1_3fcf650a *)&local_2f8);
      local_338._0_8_ = local_2d8._0_8_;
      stack0xfffffffffffffcd0 = stack0xfffffffffffffd30;
      lVar17 = 0;
      do {
        *(ulong *)(local_338 + lVar17) = *(ulong *)(local_338 + lVar17) ^ 0x8000000000000000;
        lVar17 = lVar17 + 8;
      } while (lVar17 != 0x18);
      local_338._0_8_ = (double)local_338._0_8_ + 1.0;
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&local_2f8,(detail *)local_338,cr_08);
      local_378.v._M_elems[1] = local_2f8.v._M_elems[1];
      local_378.v._M_elems[2] = local_2f8.v._M_elems[2];
      local_378.v._M_elems[0] = local_2f8.v._M_elems[0] * 0.5;
      if ((local_2f8.v._M_elems[1] != 0.0) || (NAN(local_2f8.v._M_elems[1]))) {
        local_378.v._M_elems[1] = local_2f8.v._M_elems[1] * 0.5;
      }
      if (local_2f8.v._M_elems[2] != 0.0) {
        local_378.v._M_elems[2] = local_2f8.v._M_elems[2] * 0.5;
      }
      lVar17 = 0;
      do {
        local_210[lVar17] = local_298.v._M_elems[lVar17] + local_378.v._M_elems[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar17 = 0;
      if ((double)local_140 <= 0.0) {
        if (0.0 <= (double)local_140) {
          do {
            *(double *)(local_2d8 + lVar17 * 8) = local_178[lVar17] - local_258[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_298.v._M_elems[0] = exp((double)local_2d8._0_8_);
          local_378.v._M_elems[0] = (double)&local_298;
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
          apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                    ((fvar<double,_2UL> *)local_338,local_2d8,2,
                     (anon_class_8_1_3fcf650a *)&local_378);
          local_2f8.v._M_elems[1] = (double)local_338._8_8_;
          local_2f8.v._M_elems[2] = (double)local_328;
          local_2f8.v._M_elems[0] = (double)local_338._0_8_ + 1.0;
          lVar17 = 0;
          do {
            local_2b8.v._M_elems[lVar17] = local_198[lVar17] - local_258[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_298.v._M_elems[0] = exp(local_2b8.v._M_elems[0]);
          local_378.v._M_elems[0] = (double)&local_298;
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
          apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                    ((fvar<double,_2UL> *)local_318,&local_2b8,2,
                     (anon_class_8_1_3fcf650a *)&local_378);
          lVar17 = 0;
          do {
            local_378.v._M_elems[lVar17] =
                 local_2f8.v._M_elems[lVar17] + *(double *)(local_318 + lVar17 * 8);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                    (&local_298,(detail *)&local_378,cr_11);
          lVar17 = 0;
          do {
            adStack_78[lVar17] = local_258[lVar17] + local_298.v._M_elems[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          lVar17 = 0;
          do {
            *(double *)((long)adStack_78 + lVar17) =
                 *(double *)((long)adStack_78 + lVar17) / local_268;
            lVar17 = lVar17 + 8;
          } while (lVar17 != 0x18);
          lVar17 = 0;
          do {
            local_210[lVar17] = adStack_78[lVar17] + local_210[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        else {
          do {
            *(double *)(local_318 + lVar17 * 8) = local_178[lVar17] - local_258[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_298.v._M_elems[0] = exp((double)local_318);
          local_378.v._M_elems[0] = (double)&local_298;
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
          apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                    ((fvar<double,_2UL> *)local_2d8,local_318,2,
                     (anon_class_8_1_3fcf650a *)&local_378);
          stack0xfffffffffffffcd0 = stack0xfffffffffffffd30;
          local_338._0_8_ = (double)local_2d8._0_8_ + 1.0;
          lVar17 = 0;
          do {
            *(double *)(auStack_350 + lVar17 * 8 + -8) = local_198[lVar17] - local_258[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_298.v._M_elems[0] = exp((double)local_358);
          local_378.v._M_elems[0] = (double)&local_298;
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
          apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                    (&local_2b8,&local_358,2,(anon_class_8_1_3fcf650a *)&local_378);
          lVar17 = 0;
          do {
            local_2f8.v._M_elems[lVar17] =
                 *(double *)(local_338 + lVar17 * 8) + local_2b8.v._M_elems[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          lVar17 = 0;
          do {
            (&local_1d0)[lVar17] = (fvar<double,_2UL> *)(local_108[lVar17] - local_258[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_298.v._M_elems[0] = exp((double)local_1d0);
          local_378.v._M_elems[0] = (double)&local_298;
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
          apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                    (&local_158,&local_1d0,2,(anon_class_8_1_3fcf650a *)&local_378);
          lVar17 = 0;
          do {
            local_378.v._M_elems[lVar17] =
                 local_2f8.v._M_elems[lVar17] + local_158.v._M_elems[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                    (&local_298,(detail *)&local_378,cr_10);
          lVar17 = 0;
          do {
            adStack_78[lVar17 + 3] = local_258[lVar17] + local_298.v._M_elems[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          lVar17 = 0;
          do {
            *(double *)((long)adStack_78 + lVar17 + 0x18) =
                 *(double *)((long)adStack_78 + lVar17 + 0x18) / local_268;
            lVar17 = lVar17 + 8;
          } while (lVar17 != 0x18);
          lVar17 = 0;
          do {
            local_210[lVar17] = adStack_78[lVar17 + 3] + local_210[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
      }
      else {
        do {
          *(double *)(local_318 + lVar17 * 8) = local_178[lVar17] - local_258[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_298.v._M_elems[0] = exp((double)local_318);
        local_378.v._M_elems[0] = (double)&local_298;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
        apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                  ((fvar<double,_2UL> *)local_2d8,local_318,2,(anon_class_8_1_3fcf650a *)&local_378)
        ;
        stack0xfffffffffffffcd0 = stack0xfffffffffffffd30;
        local_338._0_8_ = (double)local_2d8._0_8_ + 1.0;
        lVar17 = 0;
        do {
          *(double *)(auStack_350 + lVar17 * 8 + -8) = local_198[lVar17] - local_258[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_298.v._M_elems[0] = exp((double)local_358);
        local_378.v._M_elems[0] = (double)&local_298;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
        apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                  (&local_2b8,&local_358,2,(anon_class_8_1_3fcf650a *)&local_378);
        lVar17 = 0;
        do {
          local_2f8.v._M_elems[lVar17] =
               *(double *)(local_338 + lVar17 * 8) + local_2b8.v._M_elems[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        lVar17 = 0;
        do {
          (&local_1d0)[lVar17] = (fvar<double,_2UL> *)(local_108[lVar17] - local_258[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_298.v._M_elems[0] = exp((double)local_1d0);
        local_378.v._M_elems[0] = (double)&local_298;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::
        apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>const&)::_lambda(unsigned_long)_1_>
                  (&local_158,&local_1d0,2,(anon_class_8_1_3fcf650a *)&local_378);
        lVar17 = 0;
        do {
          local_378.v._M_elems[lVar17] = local_2f8.v._M_elems[lVar17] - local_158.v._M_elems[lVar17]
          ;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                  (&local_298,(detail *)&local_378,cr_09);
        lVar17 = 0;
        do {
          adStack_78[lVar17 + 6] = local_258[lVar17] + local_298.v._M_elems[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        lVar17 = 0;
        do {
          *(double *)((long)adStack_78 + lVar17 + 0x30) =
               *(double *)((long)adStack_78 + lVar17 + 0x30) / local_268;
          lVar17 = lVar17 + 8;
        } while (lVar17 != 0x18);
        lVar17 = 0;
        do {
          local_210[lVar17] = adStack_78[lVar17 + 6] + local_210[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
      }
      lVar17 = 0;
      do {
        *(ulong *)((long)local_210 + lVar17) =
             *(ulong *)((long)local_210 + lVar17) ^ 0x8000000000000000;
        lVar17 = lVar17 + 8;
      } while (lVar17 != 0x18);
      *local_220 = local_210[0] / beta.v._M_elems[0];
      lVar20 = 1;
      lVar17 = 0x10;
      pdVar16 = local_220;
      do {
        dVar32 = 0.0;
        lVar25 = 8;
        pdVar21 = pdVar16;
        do {
          dVar32 = dVar32 + *(double *)((long)beta.v._M_elems + lVar25) * *pdVar21;
          pdVar21 = pdVar21 + -1;
          lVar25 = lVar25 + 8;
        } while (lVar17 != lVar25);
        local_220[lVar20] = (local_210[lVar20] - dVar32) / beta.v._M_elems[0];
        lVar20 = lVar20 + 1;
        pdVar16 = pdVar16 + 1;
        lVar17 = 0x18;
      } while (lVar20 != 3);
      return (fvar<double,_2UL> *)local_220;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,this,pfVar19,i);
    std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U finite(I Lx, I Ly, T Jx, T Jy, U beta) {
  typedef I int_t;
  typedef T real_t;
  typedef U value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto a = beta * Jx;
  auto b = beta * Jy;
  value_t lp0(0), lp1(0), lp2(0), lp3(0);
  auto gamma0 = log((1 + cosh(2 * a)) / sinh(2 * a)) - 2 * b;
  for (int_t k = 0; k < 2 * Ly; ++k) {
    auto cosh_g = (cosh(2 * a) * cosh(2 * b) - cos(pi * k / Ly) * sinh(2 * b)) /
                  sinh(2 * a);
    auto gamma =
        (k == 0) ? abs(gamma0) : (log(cosh_g + sqrt(cosh_g * cosh_g - 1)));
    if ((k & 1) == 1) {
      lp0 += (Lx * gamma / 2) + log(1 + exp(-(Lx * gamma)));
      lp1 += (Lx * gamma / 2) + log(1 - exp(-(Lx * gamma)));
    } else {
      lp2 += (Lx * gamma / 2) + log(1 + exp(-(Lx * gamma)));
      lp3 += (Lx * gamma / 2) + log(1 - exp(-(Lx * gamma)));
    }
  }
  auto logZ =
      -log(real_t(2)) / (Lx * Ly) + a + real_t(1) / 2 * log(1 - exp(-4 * a));
  if (gamma0 > 0) {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0) - exp(lp3 - lp0))) /
            (Lx * Ly);
  } else if (gamma0 < 0) {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0) + exp(lp3 - lp0))) /
            (Lx * Ly);
  } else {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0))) / (Lx * Ly);
  }
  return -logZ / beta;
}